

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O2

HighsStatus __thiscall
Highs::openWriteFile
          (Highs *this,string *filename,string *method_name,FILE **file,HighsFileType *file_type)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  FILE *pFVar4;
  char *__lhs;
  HighsStatus HVar5;
  HighsStatus HVar6;
  
  *file_type = kFull;
  bVar2 = std::operator==(filename,"");
  if (bVar2) {
    *file = _stdout;
    HVar6 = kOk;
  }
  else {
    pFVar4 = fopen((filename->_M_dataplus)._M_p,"w");
    *file = (FILE *)pFVar4;
    if (pFVar4 == (FILE *)0x0) {
      highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                   "Cannot open writable file \"%s\" in %s\n",(filename->_M_dataplus)._M_p,
                   (method_name->_M_dataplus)._M_p);
      HVar6 = kError;
    }
    else {
      __lhs = strrchr((filename->_M_dataplus)._M_p,0x2e);
      HVar5 = kOk;
      HVar6 = kOk;
      if (__lhs != (char *)0x0) {
        bVar2 = std::operator!=(__lhs,filename);
        HVar6 = HVar5;
        if (bVar2) {
          iVar3 = strcmp(__lhs + 1,"mps");
          if (iVar3 == 0) {
            *file_type = kMps;
          }
          else {
            cVar1 = __lhs[1];
            if (cVar1 == 'm') {
              if ((__lhs[2] == 'd') && (__lhs[3] == '\0')) {
                *file_type = kMd;
              }
            }
            else if (((cVar1 == 'l') && (__lhs[2] == 'p')) && (__lhs[3] == '\0')) {
              *file_type = kLp;
            }
          }
        }
      }
    }
  }
  return HVar6;
}

Assistant:

HighsStatus Highs::openWriteFile(const string filename,
                                 const string method_name, FILE*& file,
                                 HighsFileType& file_type) const {
  file_type = HighsFileType::kFull;
  if (filename == "") {
    // Empty file name: use stdout
    file = stdout;
  } else {
    file = fopen(filename.c_str(), "w");
    if (file == 0) {
      highsLogUser(options_.log_options, HighsLogType::kError,
                   "Cannot open writable file \"%s\" in %s\n", filename.c_str(),
                   method_name.c_str());
      return HighsStatus::kError;
    }
    const char* dot = strrchr(filename.c_str(), '.');
    if (dot && dot != filename) {
      if (strcmp(dot + 1, "mps") == 0) {
        file_type = HighsFileType::kMps;
      } else if (strcmp(dot + 1, "lp") == 0) {
        file_type = HighsFileType::kLp;
      } else if (strcmp(dot + 1, "md") == 0) {
        file_type = HighsFileType::kMd;
      }
    }
  }
  return HighsStatus::kOk;
}